

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O1

controller * __thiscall
boost::ext::di::v1_3_0::providers::stack_over_heap::
get<controller,boost::ext::di::v1_3_0::core::successful::any_type_ref<controller,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>,boost::ext::di::v1_3_0::core::successful::any_type_ref<controller,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (stack_over_heap *this,direct *param_1,heap *param_2,
          any_type_ref<controller,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
          *args,any_type_ref<controller,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
                *args_1)

{
  controller *pcVar1;
  scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> local_21;
  provider<boost::ext::di::v1_3_0::aux::pair<model,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  local_20;
  
  pcVar1 = (controller *)operator_new(1);
  local_20.injector_ = args->injector_;
  scopes::singleton::scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
  create_impl<model,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<model,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
            (&local_21,&local_20);
  local_20.injector_ = args_1->injector_;
  scopes::singleton::scope_impl<view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
  create_impl<view,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<view,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<view>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<view>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
            ((scope_impl<view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *)&local_21
             ,(provider<boost::ext::di::v1_3_0::aux::pair<view,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<view>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<view>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
               *)&local_20);
  return pcVar1;
}

Assistant:

auto get(const type_traits::direct&, const type_traits::heap&, TArgs&&... args) const {
    return new T(static_cast<TArgs&&>(args)...);
  }